

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall
Am_Value_List::Append_New(Am_Value_List *this,Am_Value_List *other_value,bool unique)

{
  bool bVar1;
  Am_Value_List_Data *this_00;
  Am_Value *in_value;
  undefined1 local_40 [8];
  Am_Value v;
  bool unique_local;
  Am_Value_List *other_value_local;
  Am_Value_List *this_local;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value::Am_Value((Am_Value *)local_40);
  Start(other_value);
  while (bVar1 = Last(other_value), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_value = Get(other_value);
    Am_Value::operator=((Am_Value *)local_40,in_value);
    bVar1 = Start_Member(this,(Am_Value *)local_40);
    if (!bVar1) {
      Add(this,(Am_Value *)local_40,Am_TAIL,false);
    }
    Next(other_value);
  }
  Am_Value::~Am_Value((Am_Value *)local_40);
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Append_New(Am_Value_List &other_value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  Am_Value v;
  for (other_value.Start(); !other_value.Last(); other_value.Next()) {
    v = other_value.Get();
    if (!Start_Member(v))
      Add(v, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}